

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplexmain.cpp
# Opt level: O1

void freeStrings(char **s1,char **s2,char **s3,char **s4,char **s5)

{
  if (*s1 != (char *)0x0) {
    operator_delete__(*s1);
    *s1 = (char *)0x0;
  }
  if (*s2 != (char *)0x0) {
    operator_delete__(*s2);
    *s2 = (char *)0x0;
  }
  if (*s3 != (char *)0x0) {
    operator_delete__(*s3);
    *s3 = (char *)0x0;
  }
  if (*s4 != (char *)0x0) {
    operator_delete__(*s4);
    *s4 = (char *)0x0;
  }
  if (*s5 != (char *)0x0) {
    operator_delete__(*s5);
    *s5 = (char *)0x0;
  }
  return;
}

Assistant:

static
void freeStrings(char*& s1, char*& s2, char*& s3, char*& s4, char*& s5)
{
   if(s1 != nullptr)
   {
      delete [] s1;
      s1 = nullptr;
   }

   if(s2 != nullptr)
   {
      delete [] s2;
      s2 = nullptr;
   }

   if(s3 != nullptr)
   {
      delete [] s3;
      s3 = nullptr;
   }

   if(s4 != nullptr)
   {
      delete [] s4;
      s4 = nullptr;
   }

   if(s5 != nullptr)
   {
      delete [] s5;
      s5 = nullptr;
   }
}